

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_tests.cpp
# Opt level: O3

void __thiscall
Inject::ctor_inject::ctor_inject
          (ctor_inject *this,type *service1,type *service2,type *service3,type *service4,
          type *service5)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long local_190;
  unique_id local_188;
  unique_id *local_180;
  long *local_178;
  undefined **local_170;
  undefined1 local_168;
  undefined8 *local_160;
  char *local_158;
  undefined **local_150;
  undefined1 local_148;
  undefined8 *local_140;
  unique_id **local_138;
  undefined1 local_130 [8];
  undefined8 local_128;
  shared_count sStack_120;
  undefined **local_118;
  undefined1 local_110;
  undefined8 *local_108;
  long **local_100;
  char *local_f8;
  char *local_f0;
  type *local_e8;
  type *local_e0;
  type *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  this->ctor_num = 5;
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x26f);
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00163f68;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = "";
  if (service1->px != (element_type *)0x0) {
    iVar1 = (**service1->px->_vptr_service)();
    local_190 = CONCAT44(extraout_var,iVar1);
    local_e8 = service5;
    local_e0 = service4;
    local_d8 = service3;
    local_188 = inject::id_of<Inject::impl1>::id();
    local_180 = &local_188;
    local_178 = &local_190;
    local_130[0] = local_190 == local_188;
    local_128 = 0;
    sStack_120.pi_ = (sp_counted_base *)0x0;
    local_f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_f0 = "";
    local_100 = &local_178;
    local_110 = 0;
    local_118 = &PTR__lazy_ostream_00163fb8;
    local_108 = &boost::unit_test::lazy_ostream::inst;
    local_138 = &local_180;
    local_148 = 0;
    local_150 = &PTR__lazy_ostream_00163fb8;
    local_140 = &boost::unit_test::lazy_ostream::inst;
    boost::test_tools::tt_detail::report_assertion
              (local_130,&local_170,&local_f8,0x26f,1,2,2,"service1->id()",&local_118,
               "id_of<impl1>::id()",&local_150);
    boost::detail::shared_count::~shared_count(&sStack_120);
    local_60 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
    ;
    local_58 = "";
    local_70 = &boost::unit_test::basic_cstring<char_const>::null;
    local_68 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x270);
    local_168 = 0;
    local_170 = &PTR__lazy_ostream_00163f68;
    local_160 = &boost::unit_test::lazy_ostream::inst;
    local_158 = "";
    if (service2->px != (element_type *)0x0) {
      iVar1 = (**service2->px->_vptr_service)();
      local_190 = CONCAT44(extraout_var_00,iVar1);
      local_188 = inject::id_of<Inject::impl1>::id();
      local_130[0] = local_190 == local_188;
      local_128 = 0;
      sStack_120.pi_ = (sp_counted_base *)0x0;
      local_f8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
      ;
      local_f0 = "";
      local_178 = &local_190;
      local_110 = 0;
      local_118 = &PTR__lazy_ostream_00163fb8;
      local_108 = &boost::unit_test::lazy_ostream::inst;
      local_100 = &local_178;
      local_180 = &local_188;
      local_148 = 0;
      local_150 = &PTR__lazy_ostream_00163fb8;
      local_140 = &boost::unit_test::lazy_ostream::inst;
      local_138 = &local_180;
      boost::test_tools::tt_detail::report_assertion
                (local_130,&local_170,&local_f8,0x270,1,2,2,"service2->id()",&local_118,
                 "id_of<impl1>::id()",&local_150);
      boost::detail::shared_count::~shared_count(&sStack_120);
      local_80 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
      ;
      local_78 = "";
      local_90 = &boost::unit_test::basic_cstring<char_const>::null;
      local_88 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x271);
      local_168 = 0;
      local_170 = &PTR__lazy_ostream_00163f68;
      local_160 = &boost::unit_test::lazy_ostream::inst;
      local_158 = "";
      if (local_d8->px != (element_type *)0x0) {
        iVar1 = (**local_d8->px->_vptr_service)();
        local_190 = CONCAT44(extraout_var_01,iVar1);
        local_188 = inject::id_of<Inject::impl1>::id();
        local_130[0] = CONCAT44(extraout_var_01,iVar1) == local_188;
        local_128 = 0;
        sStack_120.pi_ = (sp_counted_base *)0x0;
        local_f8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
        ;
        local_f0 = "";
        local_178 = &local_190;
        local_110 = 0;
        local_118 = &PTR__lazy_ostream_00163fb8;
        local_108 = &boost::unit_test::lazy_ostream::inst;
        local_100 = &local_178;
        local_180 = &local_188;
        local_148 = 0;
        local_150 = &PTR__lazy_ostream_00163fb8;
        local_140 = &boost::unit_test::lazy_ostream::inst;
        local_138 = &local_180;
        boost::test_tools::tt_detail::report_assertion
                  (local_130,&local_170,&local_f8,0x271,1,2,2,"service3->id()",&local_118,
                   "id_of<impl1>::id()",&local_150);
        boost::detail::shared_count::~shared_count(&sStack_120);
        local_a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
        ;
        local_98 = "";
        local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x272);
        local_168 = 0;
        local_170 = &PTR__lazy_ostream_00163f68;
        local_160 = &boost::unit_test::lazy_ostream::inst;
        local_158 = "";
        if (local_e0->px != (element_type *)0x0) {
          iVar1 = (**local_e0->px->_vptr_service)();
          local_190 = CONCAT44(extraout_var_02,iVar1);
          local_188 = inject::id_of<Inject::impl1>::id();
          local_130[0] = CONCAT44(extraout_var_02,iVar1) == local_188;
          local_128 = 0;
          sStack_120.pi_ = (sp_counted_base *)0x0;
          local_f8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
          ;
          local_f0 = "";
          local_178 = &local_190;
          local_110 = 0;
          local_118 = &PTR__lazy_ostream_00163fb8;
          local_108 = &boost::unit_test::lazy_ostream::inst;
          local_100 = &local_178;
          local_180 = &local_188;
          local_148 = 0;
          local_150 = &PTR__lazy_ostream_00163fb8;
          local_140 = &boost::unit_test::lazy_ostream::inst;
          local_138 = &local_180;
          boost::test_tools::tt_detail::report_assertion
                    (local_130,&local_170,&local_f8,0x272,1,2,2,"service4->id()",&local_118,
                     "id_of<impl1>::id()",&local_150);
          boost::detail::shared_count::~shared_count(&sStack_120);
          local_c0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
          ;
          local_b8 = "";
          local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x273);
          local_168 = 0;
          local_170 = &PTR__lazy_ostream_00163f68;
          local_160 = &boost::unit_test::lazy_ostream::inst;
          local_158 = "";
          if (local_e8->px != (element_type *)0x0) {
            iVar1 = (**local_e8->px->_vptr_service)();
            local_190 = CONCAT44(extraout_var_03,iVar1);
            local_188 = inject::id_of<Inject::impl1>::id();
            local_130[0] = CONCAT44(extraout_var_03,iVar1) == local_188;
            local_128 = 0;
            sStack_120.pi_ = (sp_counted_base *)0x0;
            local_f8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/z9u2k[P]inject/src/tests/inject/unit_tests.cpp"
            ;
            local_f0 = "";
            local_178 = &local_190;
            local_110 = 0;
            local_118 = &PTR__lazy_ostream_00163fb8;
            local_108 = &boost::unit_test::lazy_ostream::inst;
            local_100 = &local_178;
            local_180 = &local_188;
            local_148 = 0;
            local_150 = &PTR__lazy_ostream_00163fb8;
            local_140 = &boost::unit_test::lazy_ostream::inst;
            local_138 = &local_180;
            boost::test_tools::tt_detail::report_assertion
                      (local_130,&local_170,&local_f8,0x273,1,2,2,"service5->id()",&local_118,
                       "id_of<impl1>::id()",&local_150);
            boost::detail::shared_count::~shared_count(&sStack_120);
            return;
          }
        }
      }
    }
  }
  local_158 = "";
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_00163f68;
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Inject::service>::operator->() const [T = Inject::service]"
               );
}

Assistant:

ctor_inject(
            context<>::ptr<service>::type service1,
            context<>::ptr<service>::type service2,
            context<>::ptr<service>::type service3,
            context<>::ptr<service>::type service4,
            context<>::ptr<service>::type service5) {
        ctor_num = 5;
        BOOST_CHECK_EQUAL(service1->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service2->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service3->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service4->id(), id_of<impl1>::id());
        BOOST_CHECK_EQUAL(service5->id(), id_of<impl1>::id());
    }